

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NodeImpl.cc
# Opt level: O0

void __thiscall avro::NodeUnion::printJson(NodeUnion *this,ostream *os,int depth)

{
  size_t sVar1;
  shared_ptr<avro::Node> *this_00;
  type pNVar2;
  ostream *poVar3;
  int in_EDX;
  ostream *in_RSI;
  int i;
  int fields;
  size_t in_stack_ffffffffffffffb8;
  MultiAttribute<boost::shared_ptr<avro::Node>_> *in_stack_ffffffffffffffc0;
  ostream *in_stack_ffffffffffffffd8;
  indent local_20;
  indent x;
  
  std::operator<<(in_RSI,"[\n");
  sVar1 = concepts::MultiAttribute<boost::shared_ptr<avro::Node>_>::size
                    ((MultiAttribute<boost::shared_ptr<avro::Node>_> *)0x1cc9bb);
  for (x.d = 0; x.d < (int)sVar1; x.d = x.d + 1) {
    if (0 < x.d) {
      std::operator<<(in_RSI,",\n");
    }
    indent::indent(&local_20,in_EDX + 1U);
    operator<<(in_stack_ffffffffffffffd8,x);
    this_00 = concepts::MultiAttribute<boost::shared_ptr<avro::Node>_>::get
                        (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
    pNVar2 = boost::shared_ptr<avro::Node>::operator->(this_00);
    (*pNVar2->_vptr_Node[0xd])(pNVar2,in_RSI,(ulong)(in_EDX + 1U));
  }
  std::operator<<(in_RSI,'\n');
  indent::indent((indent *)&stack0xffffffffffffffdc,in_EDX);
  poVar3 = operator<<(in_stack_ffffffffffffffd8,x);
  std::operator<<(poVar3,']');
  return;
}

Assistant:

void 
NodeUnion::printJson(std::ostream &os, int depth) const
{
    os << "[\n";
    int fields = leafAttributes_.size();
    ++depth;
    for(int i = 0; i < fields; ++i) {
        if(i > 0) {
            os << ",\n";
        }
        os << indent(depth);
        leafAttributes_.get(i)->printJson(os, depth);
    }
    os << '\n';
    os << indent(--depth) << ']';
}